

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O0

int32 read_sendump(s2_semi_mgau_t *s,bin_mdef_t *mdef,char *file)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mmio_file_t *pmVar5;
  void *pvVar6;
  uint8 *puVar7;
  uint8 ***pppuVar8;
  uint local_454;
  int local_450;
  int step_1;
  int step;
  int n_bits;
  int n_sen;
  int n_density;
  int n_feat;
  int n_clust;
  size_t offset;
  int32 do_mmap;
  int32 do_swap;
  int32 c;
  int32 r;
  int32 n;
  int32 i;
  char line [1000];
  FILE *fp;
  char *file_local;
  bin_mdef_t *mdef_local;
  s2_semi_mgau_t *s_local;
  
  n_density = 0;
  n_sen = s->g->n_feat;
  n_bits = s->g->n_density;
  step = mdef->n_sen;
  step_1 = 8;
  s->n_sen = step;
  iVar2 = ps_config_bool(s->config,"mmap");
  line._992_8_ = fopen(file,"rb");
  if ((FILE *)line._992_8_ == (FILE *)0x0) {
    return -1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x389,"Loading senones from dump file %s\n",file);
  sVar4 = fread(&c,4,1,(FILE *)line._992_8_);
  if (sVar4 == 1) {
    bVar1 = false;
    if ((c < 1) || (999 < c)) {
      c = c >> 0x18 & 0xffU | c >> 8 & 0xff00U | (c & 0xff00U) << 8 | c << 0x18;
      if ((c < 1) || (999 < c)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x394,"Title length %x in dump file %s out of range\n",(ulong)(uint)c,file);
        goto LAB_00160390;
      }
      bVar1 = true;
    }
    sVar4 = fread(&n,1,(long)c,(FILE *)line._992_8_);
    if (sVar4 == (long)c) {
      if (*(char *)((long)&n + (long)(c + -1)) == '\0') {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x3a1,"%s\n",&n);
        sVar4 = fread(&c,4,1,(FILE *)line._992_8_);
        if (sVar4 == 1) {
          if (bVar1) {
            c = c >> 0x18 & 0xffU | c >> 8 & 0xff00U | (c & 0xff00U) << 8 | c << 0x18;
          }
          sVar4 = fread(&n,1,(long)c,(FILE *)line._992_8_);
          if (sVar4 == (long)c) {
            if (*(char *)((long)&n + (long)(c + -1)) == '\0') {
              while (sVar4 = fread(&c,4,1,(FILE *)line._992_8_), sVar4 == 1) {
                if (bVar1) {
                  c = c >> 0x18 & 0xffU | c >> 8 & 0xff00U | (c & 0xff00U) << 8 | c << 0x18;
                }
                if (c == 0) {
                  do_mmap = step;
                  do_swap = n_bits;
                  if (n_density == 0) {
                    sVar4 = fread(&do_swap,4,1,(FILE *)line._992_8_);
                    if (sVar4 != 1) {
                      err_msg_system(ERR_ERROR,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                     ,0x3d7,"Cannot read #rows");
                      goto LAB_00160390;
                    }
                    if (bVar1) {
                      do_swap = do_swap >> 0x18 & 0xffU | do_swap >> 8 & 0xff00U |
                                (do_swap & 0xff00U) << 8 | do_swap << 0x18;
                    }
                    sVar4 = fread(&do_mmap,4,1,(FILE *)line._992_8_);
                    if (sVar4 != 1) {
                      err_msg_system(ERR_ERROR,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                     ,0x3dc,"Cannot read #columns");
                      goto LAB_00160390;
                    }
                    if (bVar1) {
                      do_mmap = do_mmap >> 0x18 & 0xffU | do_mmap >> 8 & 0xff00U |
                                (do_mmap & 0xff00U) << 8 | do_mmap << 0x18;
                    }
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3e0,"Rows: %d, Columns: %d\n",(ulong)(uint)do_swap,
                            (ulong)(uint)do_mmap);
                  }
                  if (n_sen != s->g->n_feat) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3e5,"Number of feature streams mismatch: %d != %d\n",
                            (ulong)(uint)n_sen,(ulong)(uint)s->g->n_feat);
                    goto LAB_00160390;
                  }
                  if (n_bits != s->g->n_density) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3ea,"Number of densities mismatch: %d != %d\n",(ulong)(uint)n_bits,
                            (ulong)(uint)s->g->n_density);
                    goto LAB_00160390;
                  }
                  if (step != s->n_sen) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3ef,"Number of senones mismatch: %d != %d\n",(ulong)(uint)step,
                            (ulong)(uint)s->n_sen);
                    goto LAB_00160390;
                  }
                  if (((n_density != 0) && (n_density != 0xf)) && (n_density != 0x10)) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3f4,"Cluster count must be 0, 15, or 16\n");
                    goto LAB_00160390;
                  }
                  if (n_density == 0xf) {
                    n_density = 0x10;
                  }
                  if ((step_1 != 8) && (step_1 != 4)) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3fb,"Cluster count must be 4 or 8\n");
                    goto LAB_00160390;
                  }
                  if (iVar2 != 0) {
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x400,"Using memory-mapped I/O for senones\n");
                  }
                  _n_feat = ftell((FILE *)line._992_8_);
                  if (iVar2 == 0) {
                    if (n_density != 0) {
                      puVar7 = (uint8 *)__ckd_calloc__(1,(long)n_density,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                                  ,0x410);
                      s->mixw_cb = puVar7;
                      sVar4 = fread(s->mixw_cb,1,(long)n_density,(FILE *)line._992_8_);
                      if (sVar4 != (long)n_density) {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                ,0x412,"Failed to read %d bytes from sendump\n",
                                (ulong)(uint)n_density);
                        goto LAB_00160390;
                      }
                    }
                  }
                  else {
                    pmVar5 = mmio_file_read(file);
                    s->sendump_mmap = pmVar5;
                    if (n_density != 0) {
                      pvVar6 = mmio_file_ptr(s->sendump_mmap);
                      s->mixw_cb = (uint8 *)((long)pvVar6 + _n_feat);
                      _n_feat = n_density + _n_feat;
                    }
                  }
                  if (s->sendump_mmap == (mmio_file_t *)0x0) {
                    pppuVar8 = (uint8 ***)
                               __ckd_calloc_3d__((long)n_sen,(long)n_bits,(long)step,1,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                                 ,0x426);
                    s->mixw = pppuVar8;
                    for (c = 0; c < n_sen; c = c + 1) {
                      local_454 = do_mmap;
                      if (step_1 == 4) {
                        local_454 = (do_mmap + 1) / 2;
                      }
                      for (r = 0; r < do_swap; r = r + 1) {
                        sVar4 = fread(s->mixw[c][r],1,(long)(int)local_454,(FILE *)line._992_8_);
                        if (sVar4 != (long)(int)local_454) {
                          err_msg(ERR_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                  ,0x42f,"Failed to read %d bytes from sendump\n",(ulong)local_454);
                          goto LAB_00160390;
                        }
                      }
                    }
                  }
                  else {
                    pppuVar8 = (uint8 ***)
                               __ckd_calloc_2d__((long)n_sen,(long)n_bits,8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                                 ,0x41a);
                    s->mixw = pppuVar8;
                    for (c = 0; c < n_sen; c = c + 1) {
                      local_450 = do_mmap;
                      if (step_1 == 4) {
                        local_450 = (do_mmap + 1) / 2;
                      }
                      for (r = 0; r < do_swap; r = r + 1) {
                        pvVar6 = mmio_file_ptr(s->sendump_mmap);
                        s->mixw[c][r] = (uint8 *)((long)pvVar6 + _n_feat);
                        _n_feat = local_450 + _n_feat;
                      }
                    }
                  }
                  fclose((FILE *)line._992_8_);
                  return 0;
                }
                sVar4 = fread(&n,1,(long)c,(FILE *)line._992_8_);
                if (sVar4 != (long)c) {
                  err_msg_system(ERR_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                 ,0x3bc,"Cannot read header");
                  goto LAB_00160390;
                }
                iVar3 = strncmp((char *)&n,"feature_count ",0xe);
                if (iVar3 == 0) {
                  n_sen = atoi(line + 6);
                }
                iVar3 = strncmp((char *)&n,"mixture_count ",0xe);
                if (iVar3 == 0) {
                  n_bits = atoi(line + 6);
                }
                iVar3 = strncmp((char *)&n,"model_count ",0xc);
                if (iVar3 == 0) {
                  step = atoi(line + 4);
                }
                iVar3 = strncmp((char *)&n,"cluster_count ",0xe);
                if (iVar3 == 0) {
                  n_density = atoi(line + 6);
                }
                iVar3 = strncmp((char *)&n,"cluster_bits ",0xd);
                if (iVar3 == 0) {
                  step_1 = atoi(line + 5);
                }
              }
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                             ,0x3b5,"Failed to read header string size from %s",file);
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                      ,0x3ae,"Bad header in dump file\n");
            }
          }
          else {
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                           ,0x3aa,"Cannot read header");
          }
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                         ,0x3a5,"Failed to read header size from %s",file);
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x39e,"Bad title in dump file\n");
      }
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                     ,0x39a,"Cannot read title");
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,0x38c,"Failed to read title size from %s",file);
  }
LAB_00160390:
  fclose((FILE *)line._992_8_);
  return -1;
}

Assistant:

static int32
read_sendump(ptm_mgau_t *s, bin_mdef_t *mdef, char const *file)
{
    FILE *fp;
    char line[1000];
    int32 i, n, r, c;
    int32 do_swap, do_mmap;
    size_t offset;
    int n_clust = 0;
    int n_feat = s->g->n_feat;
    int n_density = s->g->n_density;
    int n_sen = bin_mdef_n_sen(mdef);
    int n_bits = 8;

    s->n_sen = n_sen; /* FIXME: Should have been done earlier */
    do_mmap = ps_config_bool(s->config, "mmap");

    if ((fp = fopen(file, "rb")) == NULL)
        return -1;

    E_INFO("Loading senones from dump file %s\n", file);
    /* Read title size, title */
    if (fread(&n, sizeof(int32), 1, fp) != 1) {
        E_ERROR_SYSTEM("Failed to read title size from %s", file);
        goto error_out;
    }
    /* This is extremely bogus */
    do_swap = 0;
    if (n < 1 || n > 999) {
        SWAP_INT32(&n);
        if (n < 1 || n > 999) {
            E_ERROR("Title length %x in dump file %s out of range\n", n, file);
            goto error_out;
        }
        do_swap = 1;
    }
    if (fread(line, sizeof(char), n, fp) != (size_t)n) {
        E_ERROR_SYSTEM("Cannot read title");
        goto error_out;
    }
    if (line[n - 1] != '\0') {
        E_ERROR("Bad title in dump file\n");
        goto error_out;
    }
    E_INFO("%s\n", line);

    /* Read header size, header */
    if (fread(&n, sizeof(n), 1, fp) != 1) {
        E_ERROR_SYSTEM("Failed to read header size from %s", file);
        goto error_out;
    }
    if (do_swap) SWAP_INT32(&n);
    if (fread(line, sizeof(char), n, fp) != (size_t)n) {
        E_ERROR_SYSTEM("Cannot read header");
        goto error_out;
    }
    if (line[n - 1] != '\0') {
        E_ERROR("Bad header in dump file\n");
        goto error_out;
    }

    /* Read other header strings until string length = 0 */
    for (;;) {
        if (fread(&n, sizeof(n), 1, fp) != 1) {
            E_ERROR_SYSTEM("Failed to read header string size from %s", file);
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&n);
        if (n == 0)
            break;
        if (fread(line, sizeof(char), n, fp) != (size_t)n) {
            E_ERROR_SYSTEM("Cannot read header");
            goto error_out;
        }
        /* Look for a cluster count, if present */
        if (!strncmp(line, "feature_count ", strlen("feature_count "))) {
            n_feat = atoi(line + strlen("feature_count "));
        }
        if (!strncmp(line, "mixture_count ", strlen("mixture_count "))) {
            n_density = atoi(line + strlen("mixture_count "));
        }
        if (!strncmp(line, "model_count ", strlen("model_count "))) {
            n_sen = atoi(line + strlen("model_count "));
        }
        if (!strncmp(line, "cluster_count ", strlen("cluster_count "))) {
            n_clust = atoi(line + strlen("cluster_count "));
        }
        if (!strncmp(line, "cluster_bits ", strlen("cluster_bits "))) {
            n_bits = atoi(line + strlen("cluster_bits "));
        }
    }

    /* Defaults for #rows, #columns in mixw array. */
    c = n_sen;
    r = n_density;
    if (n_clust == 0) {
        /* Older mixw files have them here, and they might be padded. */
        if (fread(&r, sizeof(r), 1, fp) != 1) {
            E_ERROR_SYSTEM("Cannot read #rows");
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&r);
        if (fread(&c, sizeof(c), 1, fp) != 1) {
            E_ERROR_SYSTEM("Cannot read #columns");
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&c);
        E_INFO("Rows: %d, Columns: %d\n", r, c);
    }

    if (n_feat != s->g->n_feat) {
        E_ERROR("Number of feature streams mismatch: %d != %d\n",
                n_feat, s->g->n_feat);
        goto error_out;
    }
    if (n_density != s->g->n_density) {
        E_ERROR("Number of densities mismatch: %d != %d\n",
                n_density, s->g->n_density);
        goto error_out;
    }
    if (n_sen != s->n_sen) {
        E_ERROR("Number of senones mismatch: %d != %d\n",
                n_sen, s->n_sen);
        goto error_out;
    }

    if (!((n_clust == 0) || (n_clust == 15) || (n_clust == 16))) {
        E_ERROR("Cluster count must be 0, 15, or 16\n");
        goto error_out;
    }
    if (n_clust == 15)
        ++n_clust;

    if (!((n_bits == 8) || (n_bits == 4))) {
        E_ERROR("Cluster count must be 4 or 8\n");
        goto error_out;
    }

    if (do_mmap) {
            E_INFO("Using memory-mapped I/O for senones\n");
    }
    offset = ftell(fp);

    /* Allocate memory for pdfs (or memory map them) */
    if (do_mmap) {
        s->sendump_mmap = mmio_file_read(file);
        /* Get cluster codebook if any. */
        if (n_clust) {
            s->mixw_cb = ((uint8 *) mmio_file_ptr(s->sendump_mmap)) + offset;
            offset += n_clust;
        }
    }
    else {
        /* Get cluster codebook if any. */
        if (n_clust) {
            s->mixw_cb = ckd_calloc(1, n_clust);
            if (fread(s->mixw_cb, 1, n_clust, fp) != (size_t) n_clust) {
                E_ERROR("Failed to read %d bytes from sendump\n", n_clust);
                goto error_out;
            }
        }
    }

    /* Set up pointers, or read, or whatever */
    if (s->sendump_mmap) {
        s->mixw = ckd_calloc_2d(n_feat, n_density, sizeof(*s->mixw));
        for (n = 0; n < n_feat; n++) {
            int step = c;
            if (n_bits == 4)
                step = (step + 1) / 2;
            for (i = 0; i < r; i++) {
                s->mixw[n][i] = ((uint8 *) mmio_file_ptr(s->sendump_mmap)) + offset;
                offset += step;
            }
        }
    }
    else {
        s->mixw = ckd_calloc_3d(n_feat, n_density, n_sen, sizeof(***s->mixw));
        /* Read pdf values and ids */
        for (n = 0; n < n_feat; n++) {
            int step = c;
            if (n_bits == 4)
                step = (step + 1) / 2;
            for (i = 0; i < r; i++) {
                if (fread(s->mixw[n][i], sizeof(***s->mixw), step, fp)
                    != (size_t) step) {
                    E_ERROR("Failed to read %d bytes from sendump\n", step);
                    goto error_out;
                }
            }
        }
    }

    fclose(fp);
    return 0;
error_out:
    fclose(fp);
    return -1;
}